

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::expiredProcess(TimerQueue *this,Timestamp now)

{
  Timer *pTVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  int64_t iVar5;
  int64_t iVar6;
  size_t n;
  undefined1 local_38 [8];
  ActiveTimer activeTimer;
  Timer *local_20;
  Timer *timer;
  TimerQueue *this_local;
  Timestamp now_local;
  
  timer = (Timer *)this;
  this_local = (TimerQueue *)now.m_microSecondsSinceEpoch;
  net::EventLoop::assertInLoopThread(this->m_loop);
  uVar3 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar4 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar3 != sVar4) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x62,"void sznet::TimerQueue::expiredProcess(Timestamp)");
  }
  while (local_20 = MinHeap<sznet::Timer>::top(&this->m_timerMinHeap), local_20 != (Timer *)0x0) {
    activeTimer.second = (long)Timer::expiration(local_20);
    iVar5 = Timestamp::microSecondsSinceEpoch((Timestamp *)&activeTimer.second);
    iVar6 = Timestamp::microSecondsSinceEpoch((Timestamp *)&this_local);
    if (iVar6 < iVar5) break;
    n = Timer::sequence(local_20);
    std::pair<sznet::Timer_*,_long>::pair<sznet::Timer_*&,_long,_true>
              ((pair<sznet::Timer_*,_long> *)local_38,&local_20,(long *)&n);
    MinHeap<sznet::Timer>::pop(&this->m_timerMinHeap);
    sVar4 = std::
            set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
            ::erase(&this->m_activeTimers,(key_type *)local_38);
    if (sVar4 != 1) {
      __assert_fail("n == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x71,"void sznet::TimerQueue::expiredProcess(Timestamp)");
    }
    Timer::run(local_20);
    bVar2 = Timer::repeat(local_20);
    pTVar1 = local_20;
    if (bVar2) {
      Timer::restart(local_20,(Timestamp)this_local);
      addTimerInLoop(this,local_20);
    }
    else {
      if (local_20 != (Timer *)0x0) {
        Timer::~Timer(local_20);
        operator_delete(pTVar1);
      }
      local_20 = (Timer *)0x0;
    }
  }
  uVar3 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar4 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar3 != sVar4) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x7e,"void sznet::TimerQueue::expiredProcess(Timestamp)");
  }
  return;
}

Assistant:

void TimerQueue::expiredProcess(Timestamp now)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.top();
		if (!timer)
		{
			break;
		}
		if (timer->expiration().microSecondsSinceEpoch() > now.microSecondsSinceEpoch())
		{
			break;
		}
		ActiveTimer activeTimer(timer, timer->sequence());
		m_timerMinHeap.pop();
		size_t n = m_activeTimers.erase(activeTimer);
		assert(n == 1); (void)n;
		timer->run();
		if (timer->repeat())
		{
			timer->restart(now);
			addTimerInLoop(timer);
		}
		else 
		{
			delete timer;
			timer = nullptr;
		}
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}